

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
visitor_test_should_visit_message_with_multiple_chars_message_type_Test::TestBody
          (visitor_test_should_visit_message_with_multiple_chars_message_type_Test *this)

{
  bool bVar1;
  char *in_R9;
  internal local_90 [8];
  VisitError<typename_Visitor::ResultType> err;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  internal local_30 [8];
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  Fixpp::
  visit<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>
            (local_90,(Fixpp *)"8=FIX.4.4|9=84|35=BF|923=123|924=1|553=username|10=248",0x36,
             &err.storage_.initialized_);
  local_30[0] = local_90[0];
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&err.storage_.initialized_,local_30,(AssertionResult *)"err.isOk()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x36a,(char *)err.storage_._48_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)err.storage_._48_8_ != &local_40) {
      operator_delete((void *)err.storage_._48_8_,local_40._M_allocated_capacity + 1);
    }
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (((local_90[0] == (internal)0x0) && (err.storage_.storage_.__data[0x28] == '\x01')) &&
     ((undefined1 *)err.storage_.storage_._8_8_ !=
      (undefined1 *)((long)&err.storage_.storage_ + 0x18))) {
    operator_delete((void *)err.storage_.storage_._8_8_,err.storage_.storage_._24_8_ + 1);
  }
  return;
}

Assistant:

TEST(visitor_test, should_visit_message_with_multiple_chars_message_type)
{
    const char* frame = "8=FIX.4.4|9=84|35=BF|923=123|924=1|553=username|10=248";

    auto err = doVisit(frame, should_visit_message_with_multiple_chars_message_type::Visitor(), should_visit_message_with_multiple_chars_message_type::VisitRules());
    ASSERT_TRUE(err.isOk());
}